

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BigInt.h
# Opt level: O0

BigInt * __thiscall BigInt::operator+(BigInt *__return_storage_ptr__,BigInt *this,BigInt *that)

{
  longlong lVar1;
  int iVar2;
  int iVar3;
  unsigned_long *puVar4;
  size_type sVar5;
  long lVar6;
  const_reference pvVar7;
  reference pvVar8;
  long local_b8;
  BigInt local_78;
  value_type local_58 [3];
  size_type local_40;
  size_type local_38;
  uint local_2c;
  int local_28;
  int carry;
  int i;
  BigInt *that_local;
  BigInt *this_local;
  BigInt *res;
  
  _i = that;
  that_local = this;
  this_local = __return_storage_ptr__;
  if (this->sign == that->sign) {
    carry._3_1_ = 0;
    BigInt(__return_storage_ptr__,that);
    local_28 = 0;
    local_2c = 0;
    while( true ) {
      iVar2 = local_28;
      local_38 = std::vector<long_long,_std::allocator<long_long>_>::size(&this->vector_value);
      local_40 = std::vector<long_long,_std::allocator<long_long>_>::size(&_i->vector_value);
      puVar4 = std::max<unsigned_long>(&local_38,&local_40);
      iVar3 = local_28;
      if ((int)*puVar4 <= iVar2 && local_2c == 0) break;
      sVar5 = std::vector<long_long,_std::allocator<long_long>_>::size
                        (&__return_storage_ptr__->vector_value);
      if (iVar3 == (int)sVar5) {
        local_58[0] = 0;
        std::vector<long_long,_std::allocator<long_long>_>::push_back
                  (&__return_storage_ptr__->vector_value,local_58);
      }
      iVar2 = local_28;
      lVar6 = (long)(int)local_2c;
      sVar5 = std::vector<long_long,_std::allocator<long_long>_>::size(&this->vector_value);
      if (iVar2 < (int)sVar5) {
        pvVar7 = std::vector<long_long,_std::allocator<long_long>_>::operator[]
                           (&this->vector_value,(long)local_28);
        local_b8 = *pvVar7;
      }
      else {
        local_b8 = 0;
      }
      pvVar8 = std::vector<long_long,_std::allocator<long_long>_>::operator[]
                         (&__return_storage_ptr__->vector_value,(long)local_28);
      *pvVar8 = lVar6 + local_b8 + *pvVar8;
      pvVar8 = std::vector<long_long,_std::allocator<long_long>_>::operator[]
                         (&__return_storage_ptr__->vector_value,(long)local_28);
      lVar1 = base;
      local_2c = (uint)(base <= *pvVar8);
      if (local_2c != 0) {
        pvVar8 = std::vector<long_long,_std::allocator<long_long>_>::operator[]
                           (&__return_storage_ptr__->vector_value,(long)local_28);
        *pvVar8 = *pvVar8 - lVar1;
      }
      local_28 = local_28 + 1;
    }
  }
  else {
    operator-(&local_78,that);
    operator-(__return_storage_ptr__,this,&local_78);
    ~BigInt(&local_78);
  }
  return __return_storage_ptr__;
}

Assistant:

BigInt operator+(const BigInt &that) const { //! addition operator overloading
        if (sign == that.sign) {
            BigInt res = that; //! initialize with THAT, even both are negatives this will work

            //! keep looping for all digits until exhausted considering the carry (go from the least significant digit)
            for (int i = 0, carry = 0; i < (int) max(vector_value.size(), that.vector_value.size()) || carry; ++i) {

                if (i == (int) res.vector_value.size())
                    res.vector_value.push_back(0); //! due to carry the result may be n+1

                //! accumulate to this digit
                res.vector_value[i] += carry + (i < (int) vector_value.size() ? vector_value[i] : 0);

                //! make a carry to the next digit if sum can't fit in this digit
                //! same as carry = sum / base
                carry = res.vector_value[i] >= base;

                if (carry)
                    res.vector_value[i] -= base; //!keep only the remainder = sum % base
            }

            return res;
        }

        //! A+B have different signs represent them as difference
        return *this - (-that);
    }